

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# handle_commit.cxx
# Opt level: O3

bool __thiscall nuraft::raft_server::commit_in_bg_exec(raft_server *this,size_t timeout_ms)

{
  element_type *idx_to_commit;
  ulong uVar1;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar2;
  element_type *peVar3;
  context *pcVar4;
  element_type *peVar5;
  __int_type_conflict _Var6;
  long *plVar7;
  bool bVar8;
  int iVar9;
  long lVar10;
  undefined4 extraout_var_00;
  element_type *peVar11;
  uint64_t uVar12;
  byte bVar13;
  element_type *peVar14;
  Param param;
  ptr<log_entry> le;
  uint64_t log_idx;
  ptr<cluster_config> cur_config;
  unique_lock<std::mutex> ll;
  timer_helper tt;
  ExecCommitAutoCleaner exec_auto_cleaner;
  string local_128;
  undefined1 local_108 [64];
  _Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *local_c8;
  unique_lock<std::mutex> local_c0;
  undefined1 local_b0 [24];
  undefined1 local_98 [40];
  _Any_data local_70;
  code *local_60;
  code *local_58;
  function<void_()> local_50;
  undefined4 extraout_var;
  
  local_c0._M_device = &this->commit_lock_;
  iVar9 = pthread_mutex_trylock((pthread_mutex_t *)local_c0._M_device);
  bVar8 = true;
  local_c0._M_owns = iVar9 == 0;
  if (local_c0._M_owns) {
    LOCK();
    (this->sm_commit_exec_in_progress_)._M_base._M_i = true;
    UNLOCK();
    local_70._8_8_ = 0;
    local_58 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx:179:25)>
               ::_M_invoke;
    local_60 = std::
               _Function_handler<void_(),_(lambda_at_/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx:179:25)>
               ::_M_manager;
    local_70._M_unused._M_object = this;
    std::function<void_()>::function(&local_50,(function<void_()> *)&local_70);
    if (local_60 != (code *)0x0) {
      (*local_60)(&local_70,&local_70,3);
    }
    peVar14 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar14 != (element_type *)0x0) && (iVar9 = (*peVar14->_vptr_logger[7])(), 4 < iVar9)) {
      peVar14 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                ((string *)local_b0,"commit upto %lu, curruent idx %lu",
                 (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i,
                 (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i);
      (*peVar14->_vptr_logger[8])
                (peVar14,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"commit_in_bg_exec",0xb9,local_b0);
      if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
        operator_delete((void *)local_b0._0_8_);
      }
    }
    iVar9 = (*((this->log_store_).super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>.
              _M_ptr)->_vptr_log_store[3])();
    lVar10 = CONCAT44(extraout_var,iVar9);
    if ((lVar10 != 0) &&
       (uVar1 = lVar10 - 1, (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i < uVar1
       )) {
      peVar14 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      if ((peVar14 != (element_type *)0x0) && (iVar9 = (*peVar14->_vptr_logger[7])(), 2 < iVar9)) {
        peVar14 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        msg_if_given_abi_cxx11_
                  ((string *)local_b0,
                   "current commit idx %lu is smaller than log start idx %lu - 1, adjust it to %lu",
                   (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i,lVar10,uVar1);
        (*peVar14->_vptr_logger[8])
                  (peVar14,3,
                   "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                   ,"commit_in_bg_exec",0xc2,local_b0);
        if ((undefined1 *)local_b0._0_8_ != local_b0 + 0x10) {
          operator_delete((void *)local_b0._0_8_);
        }
      }
      LOCK();
      (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i = uVar1;
      UNLOCK();
    }
    get_config((raft_server *)(local_108 + 0x38));
    if (((this->leader_).super___atomic_base<int>._M_i == this->id_) &&
       ((this->role_)._M_i == leader)) {
      bVar13 = *(byte *)&((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)(local_108._56_8_ + 0x10))
                         ->_vptr__Sp_counted_base ^ 1;
    }
    else {
      bVar13 = 0;
    }
    local_b0._8_8_ = timeout_ms * 1000;
    local_b0._0_8_ = (pointer)0x0;
    local_b0[0x10] = '\x01';
    local_98._0_8_ = 0;
    local_98._8_8_ = 0;
    local_98._16_8_ = 0;
    local_98._24_8_ = (__pthread_internal_list *)0x0;
    local_98._32_8_ = (__pthread_internal_list *)0x0;
    timer_helper::reset((timer_helper *)local_b0);
    if ((this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i <
        (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i) {
      paVar2 = &local_128.field_2;
      bVar8 = false;
      local_108._32_4_ = ZEXT14(bVar13);
      local_108._40_8_ = timeout_ms;
      do {
        uVar1 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
        iVar9 = (*((this->log_store_).
                   super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr)->
                  _vptr_log_store[2])();
        if (CONCAT44(extraout_var_00,iVar9) - 1U <= uVar1) goto LAB_0021a9ab;
        if (((~bVar8 & 1U) == 0 &&
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)timeout_ms !=
             (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) &&
           (bVar8 = timer_helper::timeout((timer_helper *)local_b0), bVar8)) {
          peVar14 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          if (peVar14 == (element_type *)0x0) {
            bVar8 = false;
            goto LAB_0021aa23;
          }
          iVar9 = (*peVar14->_vptr_logger[7])();
          if (2 < iVar9) {
            peVar14 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            uVar12 = timer_helper::get_ms((timer_helper *)local_b0);
            msg_if_given_abi_cxx11_
                      (&local_128,"abort commit due to timeout (%zu ms), %lu ms elapsed",timeout_ms,
                       uVar12);
            (*peVar14->_vptr_logger[8])
                      (peVar14,3,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"commit_in_bg_exec",0xd2,&local_128);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_128._M_dataplus._M_p._4_4_,(int32)local_128._M_dataplus._M_p) !=
                paVar2) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_128._M_dataplus._M_p._4_4_,
                                          (int32)local_128._M_dataplus._M_p));
            }
          }
          bVar8 = false;
          break;
        }
        if (((this->sm_commit_paused_)._M_base._M_i & 1U) != 0) goto LAB_0021a9ab;
        peVar14 = (element_type *)(this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
        idx_to_commit = (element_type *)((long)&peVar14->_vptr_logger + 1);
        peVar11 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        if ((peVar11 != (element_type *)0x0) && (iVar9 = (*peVar11->_vptr_logger[7])(), 5 < iVar9))
        {
          peVar11 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          local_108._48_8_ = peVar14;
          msg_if_given_abi_cxx11_
                    (&local_128,"commit upto %lu, current idx %lu\n",
                     (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i,
                     idx_to_commit);
          (*peVar11->_vptr_logger[8])
                    (peVar11,6,
                     "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                     ,"commit_in_bg_exec",0xdf,&local_128);
          peVar14 = (element_type *)local_108._48_8_;
          if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
               *)CONCAT44(local_128._M_dataplus._M_p._4_4_,(int32)local_128._M_dataplus._M_p) !=
              paVar2) {
            operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                             *)CONCAT44(local_128._M_dataplus._M_p._4_4_,
                                        (int32)local_128._M_dataplus._M_p));
            peVar14 = (element_type *)local_108._48_8_;
          }
        }
        peVar3 = (this->log_store_).
                 super___shared_ptr<nuraft::log_store,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
        (*peVar3->_vptr_log_store[10])(local_108,peVar3,idx_to_commit);
        if ((element_type *)local_108._0_8_ == (element_type *)0x0) {
          peVar14 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          if ((peVar14 != (element_type *)0x0) && (iVar9 = (*peVar14->_vptr_logger[7])(), 0 < iVar9)
             ) {
            peVar14 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            msg_if_given_abi_cxx11_(&local_128,"failed to get log entry with idx %lu",idx_to_commit)
            ;
            (*peVar14->_vptr_logger[8])
                      (peVar14,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"commit_in_bg_exec",0xe5,&local_128);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_128._M_dataplus._M_p._4_4_,(int32)local_128._M_dataplus._M_p) !=
                paVar2) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_128._M_dataplus._M_p._4_4_,
                                          (int32)local_128._M_dataplus._M_p));
            }
          }
          plVar7 = *(long **)&(((this->ctx_)._M_t.
                                super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                                .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                              state_mgr_).
                              super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
          (**(code **)(*plVar7 + 0x40))(plVar7,0xffffffed);
LAB_0021ac4c:
          exit(-1);
        }
        if (*(ulong *)local_108._0_8_ == 0) {
          peVar14 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr
          ;
          if ((peVar14 != (element_type *)0x0) && (iVar9 = (*peVar14->_vptr_logger[7])(), 0 < iVar9)
             ) {
            peVar14 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                      _M_ptr;
            msg_if_given_abi_cxx11_
                      (&local_128,"empty log at idx %lu, must be log corruption",idx_to_commit);
            (*peVar14->_vptr_logger[8])
                      (peVar14,1,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"commit_in_bg_exec",0xf0,&local_128);
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_128._M_dataplus._M_p._4_4_,(int32)local_128._M_dataplus._M_p) !=
                paVar2) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_128._M_dataplus._M_p._4_4_,
                                          (int32)local_128._M_dataplus._M_p));
            }
          }
          plVar7 = *(long **)&(((this->ctx_)._M_t.
                                super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>
                                .super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl)->
                              state_mgr_).
                              super___shared_ptr<nuraft::state_mgr,_(__gnu_cxx::_Lock_policy)2>;
          (**(code **)(*plVar7 + 0x40))(plVar7,0xffffffed);
          goto LAB_0021ac4c;
        }
        if (*(log_val_type *)(local_108._0_8_ + 8) == conf) {
          commit_conf(this,(ulong)idx_to_commit,(ptr<log_entry> *)local_108);
        }
        else if (*(log_val_type *)(local_108._0_8_ + 8) == app_log) {
          commit_app_log(this,(ulong)idx_to_commit,(ptr<log_entry> *)local_108,
                         SUB41(local_108._32_4_,0));
        }
        LOCK();
        peVar11 = (element_type *)(this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
        bVar8 = peVar14 == peVar11;
        if (bVar8) {
          (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i =
               (__int_type_conflict)idx_to_commit;
          peVar11 = peVar14;
        }
        UNLOCK();
        if (bVar8) {
          snapshot_and_compact
                    (this,(this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i,false);
          local_128._M_dataplus._M_p._0_4_ = this->id_;
          local_128._M_dataplus._M_p._4_4_ = (this->leader_).super___atomic_base<int>._M_i;
          local_128._M_string_length._0_4_ = 0xffffffff;
          local_128.field_2._M_allocated_capacity = (size_type)(local_108 + 0x10);
          pcVar4 = (this->ctx_)._M_t.
                   super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
                   super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
          local_108._16_8_ = idx_to_commit;
          if ((pcVar4->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
            local_108._36_4_ = 0x13;
            local_108._24_8_ = &local_128;
            (*(pcVar4->cb_func_).func._M_invoker)
                      ((_Any_data *)&pcVar4->cb_func_,(Type *)(local_108 + 0x24),
                       (Param **)(local_108 + 0x18));
          }
        }
        else {
          peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
          if ((peVar5 != (element_type *)0x0) && (iVar9 = (*peVar5->_vptr_logger[7])(), 1 < iVar9))
          {
            peVar5 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>.
                     _M_ptr;
            msg_if_given_abi_cxx11_
                      (&local_128,
                       "sm_commit_index_ has been changed from %lu to %lu, this thread attempted %lu"
                       ,peVar14,peVar11,idx_to_commit);
            (*peVar5->_vptr_logger[8])
                      (peVar5,2,
                       "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                       ,"commit_in_bg_exec",0x10b,&local_128);
            timeout_ms = local_108._40_8_;
            if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)CONCAT44(local_128._M_dataplus._M_p._4_4_,(int32)local_128._M_dataplus._M_p) !=
                paVar2) {
              operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                               *)CONCAT44(local_128._M_dataplus._M_p._4_4_,
                                          (int32)local_128._M_dataplus._M_p));
              timeout_ms = local_108._40_8_;
            }
          }
        }
        if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
            (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
          std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                    ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
        }
        bVar8 = true;
      } while ((this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i <
               (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i);
    }
    else {
LAB_0021a9ab:
      bVar8 = true;
    }
    peVar14 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
    if ((peVar14 != (element_type *)0x0) && (iVar9 = (*peVar14->_vptr_logger[7])(), 4 < iVar9)) {
      peVar14 = (this->l_).super___shared_ptr<nuraft::logger,_(__gnu_cxx::_Lock_policy)2>._M_ptr;
      msg_if_given_abi_cxx11_
                (&local_128,"DONE: commit upto %lu, curruent idx %lu",
                 (this->quick_commit_index_).super___atomic_base<unsigned_long>._M_i,
                 (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i);
      (*peVar14->_vptr_logger[8])
                (peVar14,5,
                 "/workspace/llm4binary/github/license_all_cmakelists_25/greensky00[P]NuRaft/src/handle_commit.cxx"
                 ,"commit_in_bg_exec",0x10f,&local_128);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)CONCAT44(local_128._M_dataplus._M_p._4_4_,(int32)local_128._M_dataplus._M_p) !=
          &local_128.field_2) {
        operator_delete((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                         *)CONCAT44(local_128._M_dataplus._M_p._4_4_,
                                    (int32)local_128._M_dataplus._M_p));
      }
    }
LAB_0021aa23:
    if ((this->role_)._M_i == follower) {
      uVar1 = (this->leader_commit_index_).super___atomic_base<unsigned_long>._M_i;
      _Var6 = (this->sm_commit_index_).super___atomic_base<unsigned_long>._M_i;
      context::get_params((context *)local_108);
      if ((((this->data_fresh_)._M_base._M_i & 1U) == 0) ||
         (uVar1 <= (long)*(int *)&((element_type *)(local_108._0_8_ + 0x28))->field_0xc + _Var6)) {
        if ((((this->data_fresh_)._M_base._M_i & 1U) == 0) &&
           (uVar1 < _Var6 + (long)*(int *)&((element_type *)(local_108._0_8_ + 0x28))->value_type_))
        {
          LOCK();
          (this->data_fresh_)._M_base._M_i = true;
          UNLOCK();
          local_128._M_dataplus._M_p._0_4_ = this->id_;
          local_128._M_dataplus._M_p._4_4_ = (this->leader_).super___atomic_base<int>._M_i;
          local_128._M_string_length._0_4_ = 0xffffffff;
          local_128.field_2._M_allocated_capacity = 0;
          pcVar4 = (this->ctx_)._M_t.
                   super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>.
                   _M_t.
                   super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
                   super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
          if ((pcVar4->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
            local_108._16_4_ = 0xc;
            local_108._24_8_ = &local_128;
            (*(pcVar4->cb_func_).func._M_invoker)
                      ((_Any_data *)&pcVar4->cb_func_,(Type *)(local_108 + 0x10),
                       (Param **)(local_108 + 0x18));
          }
        }
      }
      else {
        LOCK();
        (this->data_fresh_)._M_base._M_i = false;
        UNLOCK();
        local_128._M_dataplus._M_p._0_4_ = this->id_;
        local_128._M_dataplus._M_p._4_4_ = (this->leader_).super___atomic_base<int>._M_i;
        local_128._M_string_length._0_4_ = 0xffffffff;
        local_128.field_2._M_allocated_capacity = 0;
        pcVar4 = (this->ctx_)._M_t.
                 super___uniq_ptr_impl<nuraft::context,_std::default_delete<nuraft::context>_>._M_t.
                 super__Tuple_impl<0UL,_nuraft::context_*,_std::default_delete<nuraft::context>_>.
                 super__Head_base<0UL,_nuraft::context_*,_false>._M_head_impl;
        if ((pcVar4->cb_func_).func.super__Function_base._M_manager != (_Manager_type)0x0) {
          local_108._16_4_ = 0xd;
          local_108._24_8_ = &local_128;
          (*(pcVar4->cb_func_).func._M_invoker)
                    ((_Any_data *)&pcVar4->cb_func_,(Type *)(local_108 + 0x10),
                     (Param **)(local_108 + 0x18));
        }
      }
      if ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_ !=
          (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
        std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release
                  ((_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)local_108._8_8_);
      }
    }
    if (local_c8 != (_Sp_counted_base<(__gnu_cxx::_Lock_policy)2> *)0x0) {
      std::_Sp_counted_base<(__gnu_cxx::_Lock_policy)2>::_M_release(local_c8);
    }
    commit_in_bg_exec::ExecCommitAutoCleaner::~ExecCommitAutoCleaner
              ((ExecCommitAutoCleaner *)&local_50);
  }
  std::unique_lock<std::mutex>::~unique_lock(&local_c0);
  return bVar8;
}

Assistant:

bool raft_server::commit_in_bg_exec(size_t timeout_ms) {
    std::unique_lock<std::mutex> ll(commit_lock_, std::try_to_lock);
    if (!ll.owns_lock()) {
        // Other thread is already doing commit.
        // This is caused by global workers only, as there is only one
        // thread running `commit_in_bg`. Raft server can request a new commit
        // while other worker is doing commit for that Raft server, and the
        // new request will be accepted since the global queue doesn't contain
        // the request for that Raft server (as it is popped by the worker).
        // In such a case, we can just ignore it.
        return true;
    }

    sm_commit_exec_in_progress_ = true;
    // Clear the flag automatically once we exit this function.
    struct ExecCommitAutoCleaner {
        ExecCommitAutoCleaner(std::function<void()> func) : clean_func_(func) {}
        ~ExecCommitAutoCleaner() { clean_func_(); }
        std::function<void()> clean_func_;
    } exec_auto_cleaner([this](){
        sm_commit_exec_in_progress_ = false;
        ea_sm_commit_exec_in_progress_->invoke();
    });

    p_db( "commit upto %" PRIu64 ", curruent idx %" PRIu64,
          quick_commit_index_.load(), sm_commit_index_.load() );

    ulong log_start_idx = log_store_->start_index();
    if ( log_start_idx &&
         sm_commit_index_ < log_start_idx - 1 ) {
        p_wn("current commit idx %" PRIu64 " is smaller than log start idx %" PRIu64 " - 1, "
             "adjust it to %" PRIu64 "",
             sm_commit_index_.load(),
             log_start_idx,
             log_start_idx - 1);
        sm_commit_index_ = log_start_idx - 1;
    }

    ptr<cluster_config> cur_config = get_config();
    bool need_to_handle_commit_elem = ( is_leader() &&
                                        !cur_config->is_async_replication() );

    bool first_loop_exec = true;
    bool finished_in_time = true;
    timer_helper tt(timeout_ms * 1000);
    while ( sm_commit_index_ < quick_commit_index_ &&
            sm_commit_index_ < log_store_->next_slot() - 1 ) {
        // NOTE: Skip timeout checking for the first loop execution.
        if (!first_loop_exec && timeout_ms && tt.timeout()) {
            p_wn( "abort commit due to timeout (%zu ms), %" PRIu64 " ms elapsed",
                  timeout_ms, tt.get_ms() );
            finished_in_time = false;
            break;
        }
        first_loop_exec = false;

        // Break the loop if state machine commit is paused.
        if (sm_commit_paused_) {
            break;
        }

        ulong index_to_commit = sm_commit_index_ + 1;
        p_tr( "commit upto %" PRIu64 ", current idx %" PRIu64 "\n",
              quick_commit_index_.load(), index_to_commit );

        ptr<log_entry> le = log_store_->entry_at(index_to_commit);
        if (!le)
        {
            // LCOV_EXCL_START
            p_ft( "failed to get log entry with idx %" PRIu64 "", index_to_commit );
            ctx_->state_mgr_->system_exit(raft_err::N19_bad_log_idx_for_term);
            ::exit(-1);
            // LCOV_EXCL_STOP
        }

        if (le->get_term() == 0) {
            // LCOV_EXCL_START
            // Zero term means that log store is corrupted
            // (failed to read log).
            p_ft( "empty log at idx %" PRIu64 ", must be log corruption",
                  index_to_commit );
            ctx_->state_mgr_->system_exit(raft_err::N19_bad_log_idx_for_term);
            ::exit(-1);
            // LCOV_EXCL_STOP
        }

        if (le->get_val_type() == log_val_type::app_log) {
            commit_app_log(index_to_commit, le, need_to_handle_commit_elem);

        } else if (le->get_val_type() == log_val_type::conf) {
            commit_conf(index_to_commit, le);
        }

        ulong exp_idx = index_to_commit - 1;
        if (sm_commit_index_.compare_exchange_strong(exp_idx, index_to_commit)) {
            snapshot_and_compact(sm_commit_index_);

            cb_func::Param param(id_, leader_);
            // Copy to other local variable to be safe.
            uint64_t log_idx = index_to_commit;
            param.ctx = &log_idx;
            ctx_->cb_func_.call(cb_func::StateMachineExecution, &param);
        } else {
            p_er("sm_commit_index_ has been changed from %" PRIu64 " to %" PRIu64 ", "
                 "this thread attempted %" PRIu64,
                 index_to_commit - 1,
                 exp_idx,
                 index_to_commit);
        }
    }
    p_db( "DONE: commit upto %" PRIu64 ", curruent idx %" PRIu64,
          quick_commit_index_.load(), sm_commit_index_.load() );
    if (role_ == srv_role::follower) {
        ulong leader_idx = leader_commit_index_.load();
        ulong local_idx = sm_commit_index_.load();
        ptr<raft_params> params = ctx_->get_params();

        if (data_fresh_.load() &&
            leader_idx > local_idx + params->stale_log_gap_) {
            data_fresh_.store(false);
            cb_func::Param param(id_, leader_);
            (void) ctx_->cb_func_.call(cb_func::BecomeStale, &param);

        } else if (!data_fresh_.load() &&
                   leader_idx < local_idx + params->fresh_log_gap_) {
            data_fresh_.store(true);
            cb_func::Param param(id_, leader_);
            (void) ctx_->cb_func_.call(cb_func::BecomeFresh, &param);
        }
    }
    return finished_in_time;
}